

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt2obj.cpp
# Opt level: O1

void pbrt::writeTriangleMesh(SP *mesh,affine3f *xfm)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  element_type *peVar16;
  pointer pvVar17;
  pointer pvVar18;
  ostream *poVar19;
  pointer pvVar20;
  pointer pvVar21;
  
  peVar16 = (mesh->super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pvVar17 = (peVar16->vertex).
            super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (pvVar20 = (peVar16->vertex).
                 super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
                 super__Vector_impl_data._M_start; pvVar20 != pvVar17; pvVar20 = pvVar20 + 1) {
    uVar14 = pvVar20->x;
    uVar15 = pvVar20->y;
    fVar1 = pvVar20->z;
    fVar2 = (xfm->l).vx.x;
    fVar3 = (xfm->l).vx.y;
    fVar4 = (xfm->l).vx.z;
    fVar5 = (xfm->l).vy.x;
    fVar6 = (xfm->l).vy.y;
    fVar7 = (xfm->l).vy.z;
    fVar8 = (xfm->l).vz.x;
    fVar9 = (xfm->l).vz.y;
    fVar10 = (xfm->l).vz.z;
    fVar11 = (xfm->p).x;
    fVar12 = (xfm->p).y;
    fVar13 = (xfm->p).z;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"v  ",3);
    poVar19 = std::ostream::_M_insert<double>
                        ((double)(fVar8 * fVar1 + fVar5 * (float)uVar15 + fVar2 * (float)uVar14 +
                                 fVar11));
    std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
    poVar19 = std::ostream::_M_insert<double>
                        ((double)(fVar9 * fVar1 + fVar6 * (float)uVar15 + fVar3 * (float)uVar14 +
                                 fVar12));
    std::__ostream_insert<char,std::char_traits<char>>(poVar19," ",1);
    poVar19 = std::ostream::_M_insert<double>
                        ((double)(fVar1 * fVar10 + (float)uVar15 * fVar7 + fVar4 * (float)uVar14 +
                                 fVar13));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
    std::ostream::put((char)poVar19);
    std::ostream::flush();
    numVerticesWritten = numVerticesWritten + 1;
  }
  peVar16 = (mesh->super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pvVar18 = (peVar16->index).
            super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (pvVar21 = (peVar16->index).
                 super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>._M_impl.
                 super__Vector_impl_data._M_start; pvVar21 != pvVar18; pvVar21 = pvVar21 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)out,"f ",2);
    poVar19 = std::ostream::_M_insert<unsigned_long>(0x16a760);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\t",1);
    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\t",1);
    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
    std::ostream::put((char)poVar19);
    std::ostream::flush();
  }
  numWritten = numWritten + 1;
  return;
}

Assistant:

void writeTriangleMesh(TriangleMesh::SP mesh, const affine3f &xfm)
  {
    /* TODO: export the material of that shape, and use it */
    size_t firstVertexID = numVerticesWritten+1;

    /* TODO: ignoring texture coordinates for now */

    /* TODO: ignoring shading normals for now */

    for (auto v : mesh->vertex) {
      v = xfmPoint(xfm,v);
      out << "v  " << v.x << " " << v.y << " " << v.z << std::endl;
      numVerticesWritten++;
    }

    for (auto v : mesh->index) {
      /* TODO : for texcoord and normal arrays, use x//x an x/x/x formats */
      out << "f " << (firstVertexID+v.x)
          << "\t" << (firstVertexID+v.y)
          << "\t" << (firstVertexID+v.z)
          << std::endl;
    }
    numWritten++;
  }